

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::rpc_session::rpc_session
          (rpc_session *this,uint64_t id,asio_service_impl *_impl,io_service *io,
          ssl_context *ssl_ctx,bool _enable_ssl,ptr<msg_handler> *handler,ptr<logger> *logger,
          session_closed_callback *callback)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)> *this_00;
  byte in_R9B;
  io_context *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)> *in_stack_ffffffffffffff58;
  string local_60 [16];
  context *in_stack_ffffffffffffffb0;
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *in_stack_ffffffffffffffb8;
  stream<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>_&>
  *in_stack_ffffffffffffffc0;
  
  std::enable_shared_from_this<nuraft::rpc_session>::enable_shared_from_this
            ((enable_shared_from_this<nuraft::rpc_session> *)0x2987a5);
  *(undefined8 *)(in_RDI + 0x10) = in_RSI;
  *(undefined8 *)(in_RDI + 0x18) = in_RDX;
  std::shared_ptr<nuraft::raft_server>::shared_ptr
            ((shared_ptr<nuraft::raft_server> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (shared_ptr<nuraft::raft_server> *)in_stack_ffffffffffffff48);
  asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>::
  basic_stream_socket<asio::io_context>
            ((basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
             ,0);
  asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
  stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  *(byte *)(in_RDI + 0x1f0) = in_R9B & 1;
  *(undefined4 *)(in_RDI + 500) = 0;
  std::shared_ptr<nuraft::buffer>::shared_ptr((shared_ptr<nuraft::buffer> *)0x29884d);
  nuraft::buffer::alloc((size_t)io);
  this_00 = (function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)> *)(in_RDI + 0x218);
  std::shared_ptr<nuraft::logger>::shared_ptr
            ((shared_ptr<nuraft::logger> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (shared_ptr<nuraft::logger> *)in_stack_ffffffffffffff48);
  std::function<void_(const_std::shared_ptr<nuraft::rpc_session>_&)>::function
            (this_00,in_stack_ffffffffffffff58);
  *(undefined4 *)(in_RDI + 0x248) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x24c) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x250));
  *(undefined4 *)(in_RDI + 0x270) = 0;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x218));
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x298904);
    iVar2 = (*peVar3->_vptr_logger[7])();
    if (5 < iVar2) {
      peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x298934);
      msg_if_given_abi_cxx11_((char *)local_60,"asio rpc session created: %p",in_RDI);
      (*peVar3->_vptr_logger[8])
                (peVar3,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"rpc_session",0xf1,local_60);
      std::__cxx11::string::~string(local_60);
    }
  }
  return;
}

Assistant:

rpc_session( uint64_t id,
                 asio_service_impl* _impl,
                 asio::io_service& io,
                 ssl_context& ssl_ctx,
                 bool _enable_ssl,
                 ptr<msg_handler>& handler,
                 ptr<logger>& logger,
                 session_closed_callback& callback )
        : session_id_(id)
        , impl_(_impl)
        , handler_(handler)
        , socket_(io)
        , ssl_socket_(socket_, ssl_ctx)
        , ssl_enabled_(_enable_ssl)
        , flags_(0x0)
        , log_data_()
        , header_(buffer::alloc(RPC_REQ_HEADER_SIZE))
        , l_(logger)
        , callback_(callback)
        , src_id_(-1)
        , is_leader_(false)
        , cached_port_(0)
    {
        p_tr("asio rpc session created: %p", this);
    }